

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void notch::core::Init::uniformNguyenWidrow
               (unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
                *rng,Array *weights,int nIn,int nOut)

{
  size_t sVar1;
  float *pfVar2;
  double dVar3;
  anon_class_24_3_0fc55a51 __gen;
  anon_class_24_4_29c96334 __gen_00;
  float *pfVar4;
  float fVar5;
  undefined8 local_58;
  undefined8 *local_50;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  *puStack_48;
  float local_40;
  float fStack_3c;
  undefined8 *local_38;
  unique_ptr<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_std::default_delete<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>_>_>
  *puStack_30;
  float local_28;
  undefined4 uStack_24;
  
  local_58 = 0x3f800000bf800000;
  dVar3 = pow((double)nOut,(double)(1.0 / (float)nIn));
  fVar5 = (float)(dVar3 * 0.699999988079071);
  sVar1 = weights->_M_size;
  if (sVar1 == (long)(nOut * nIn)) {
    dVar3 = (double)nIn / 3.0;
    if (dVar3 < 0.0) {
      dVar3 = sqrt(dVar3);
    }
    else {
      dVar3 = SQRT(dVar3);
    }
    fStack_3c = (float)dVar3;
    pfVar2 = weights->_M_data;
    pfVar4 = pfVar2 + weights->_M_size;
    if (weights->_M_size == 0) {
      pfVar4 = (float *)0x0;
      pfVar2 = (float *)0x0;
    }
    local_50 = &local_58;
    __gen_00.w_row_norm = fStack_3c;
    __gen_00.beta = fVar5;
    __gen_00.rng = rng;
    __gen_00.U = (uniform_real_distribution<float> *)local_50;
    puStack_48 = rng;
    local_40 = fVar5;
    ::std::
    generate<float*,notch::core::Init::uniformNguyenWidrow(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)::_lambda()_1_>
              (pfVar2,pfVar4,__gen_00);
  }
  else {
    pfVar2 = weights->_M_data;
    pfVar4 = pfVar2 + sVar1;
    if (sVar1 == 0) {
      pfVar4 = (float *)0x0;
      pfVar2 = (float *)0x0;
    }
    local_38 = &local_58;
    __gen._20_4_ = uStack_24;
    __gen.beta = fVar5;
    __gen.rng = rng;
    __gen.U = (uniform_real_distribution<float> *)local_38;
    puStack_30 = rng;
    local_28 = fVar5;
    ::std::
    generate<float*,notch::core::Init::uniformNguyenWidrow(std::unique_ptr<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>,std::default_delete<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>>&,std::valarray<float>&,int,int)::_lambda()_2_>
              (pfVar2,pfVar4,__gen);
  }
  return;
}

Assistant:

static
    void uniformNguyenWidrow(std::unique_ptr<RNG> &rng,
                             Array &weights, int nIn, int nOut) {
        std::uniform_real_distribution<float> U(-1, +1);
        float overlap = 0.7f; // "to have the intervals overlap slightly"
        float beta = overlap * pow(nOut, 1.0f / nIn); // target row norm
        if (weights.size() == static_cast<size_t>(nIn*nOut)) {
            // we're initializing weights
            float w_row_norm = sqrt(nIn / 3.0); // for nIn elems in U([-1,1])
            std::generate(std::begin(weights), std::end(weights),
                    [&U, &rng, beta, w_row_norm] {
                        // w_{ji} in U([-1,1])
                        float w_ji = U(*rng.get());
                        // to have row norm equal beta
                        return w_ji * beta / w_row_norm;
                    });
        } else { // we're initializing bias
            // b_i = uniform random number in [-beta, beta]
            std::generate(std::begin(weights), std::end(weights),
                    [&U, &rng, beta] {
                        float u = U(*rng.get());
                        return u * beta;
                    });
         }
    }